

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool anon_unknown.dwarf_997d::checkAttributeUniquenessUnsortedSet(ObjectIterator *it)

{
  bool bVar1;
  ObjectIterator *in_RDI;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar2;
  Slice key;
  unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *tmp;
  unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
  in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb7;
  ObjectIterator *this;
  string_view in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffd1;
  
  _ZTWN12_GLOBAL__N_113duplicateKeysE();
  _ZTWN12_GLOBAL__N_113duplicateKeysE();
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::
    make_unique<std::unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
              ();
    _ZTWN12_GLOBAL__N_113duplicateKeysE();
    std::
    unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::
    unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::~unique_ptr(in_stack_ffffffffffffffa0);
  }
  else {
    _ZTWN12_GLOBAL__N_113duplicateKeysE();
    std::
    unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  *)0x10b2df);
    std::
    unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::clear((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)0x10b2e7);
  }
  do {
    this = (ObjectIterator *)in_stack_ffffffffffffffb8._M_len;
    arangodb::velocypack::ObjectIterator::key(this,(bool)in_stack_ffffffffffffffb7);
    std::
    unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  *)0x10b307);
    in_stack_ffffffffffffffb8 =
         arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
         stringView((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this);
    pVar2 = std::
            unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                      ((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT61(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0)),
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_ffffffffffffffa8._M_cur);
    in_stack_ffffffffffffffa8._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
         _M_cur;
    in_stack_ffffffffffffffb0 = pVar2.second;
    if (((in_stack_ffffffffffffffb0 ^ 0xff) & 1) != 0) {
      return false;
    }
    arangodb::velocypack::ObjectIterator::next
              ((ObjectIterator *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffb0));
    bVar1 = arangodb::velocypack::ObjectIterator::valid(in_RDI);
  } while (bVar1);
  return true;
}

Assistant:

bool checkAttributeUniquenessUnsortedSet(ObjectIterator& it) {
#ifndef VELOCYPACK_NO_THREADLOCALS
  std::unique_ptr<std::unordered_set<std::string_view>>& tmp = ::duplicateKeys;

  if (::duplicateKeys == nullptr) {
    ::duplicateKeys = std::make_unique<std::unordered_set<std::string_view>>();
  } else {
    ::duplicateKeys->clear();
  }
#else
  auto tmp = std::make_unique<std::unordered_set<std::string_view>>();
#endif

  do {
    Slice key = it.key(true);
    // key(true) guarantees a String as returned type
    VELOCYPACK_ASSERT(key.isString());
    if (VELOCYPACK_UNLIKELY(!tmp->emplace(key.stringView()).second)) {
      // identical key
      return false;
    }
    it.next();
  } while (it.valid());

  return true;
}